

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

size_t __thiscall
AccountingTestMemoryAllocator::removeHeadAndReturnSize(AccountingTestMemoryAllocator *this)

{
  AccountingTestMemoryAllocatorMemoryNode *pAVar1;
  size_t sVar2;
  size_t size;
  AccountingTestMemoryAllocatorMemoryNode *foundNode;
  AccountingTestMemoryAllocator *this_local;
  
  pAVar1 = this->head_;
  this->head_ = this->head_->next_;
  sVar2 = pAVar1->size_;
  (*this->originalAllocator_->_vptr_TestMemoryAllocator[3])
            (this->originalAllocator_,pAVar1,sVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
             ,0x292);
  return sVar2;
}

Assistant:

size_t AccountingTestMemoryAllocator::removeHeadAndReturnSize()
{
    AccountingTestMemoryAllocatorMemoryNode* foundNode = head_;
    head_ = head_->next_;

    size_t size = foundNode->size_;
    originalAllocator_->free_memory((char*) foundNode, size, __FILE__, __LINE__);
    return size;
}